

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O3

void __thiscall
Octree::CmdTransferOwnership
          (Octree *this,shared_ptr<myvk::CommandBuffer> *command_buffer,uint32_t src_queue_family,
          uint32_t dst_queue_family,VkPipelineStageFlags src_stage,VkPipelineStageFlags dst_stage)

{
  CommandBuffer *this_00;
  initializer_list<VkBufferMemoryBarrier> __l;
  allocator_type local_b9;
  vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> local_b8;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_a0;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_88;
  BufferSubresourceRange local_68;
  VkBufferMemoryBarrier local_58;
  
  this_00 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  local_b8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.offset = 0;
  local_68.size = this->m_range;
  myvk::BufferBase::GetMemoryBarrier
            (&local_58,
             &((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_BufferBase,&local_68,0,0,src_queue_family,dst_queue_family);
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (&local_a0,__l,&local_b9);
  local_88.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::CommandBuffer::CmdPipelineBarrier(this_00,src_stage,dst_stage,&local_b8,&local_a0,&local_88)
  ;
  if (local_88.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Octree::CmdTransferOwnership(const std::shared_ptr<myvk::CommandBuffer> &command_buffer, uint32_t src_queue_family,
                                  uint32_t dst_queue_family, VkPipelineStageFlags src_stage,
                                  VkPipelineStageFlags dst_stage) const {
	command_buffer->CmdPipelineBarrier(
	    src_stage, dst_stage, {}, {m_buffer->GetMemoryBarrier({0, m_range}, 0, 0, src_queue_family, dst_queue_family)},
	    {});
}